

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLFileData.h
# Opt level: O0

void __thiscall Assimp::MDL::IntSharedData_MDL7::~IntSharedData_MDL7(IntSharedData_MDL7 *this)

{
  IntBone_MDL7 *this_00;
  uint local_14;
  uint m;
  IntSharedData_MDL7 *this_local;
  
  if (this->apcOutBones != (IntBone_MDL7 **)0x0) {
    for (local_14 = 0; local_14 < this->iNum; local_14 = local_14 + 1) {
      this_00 = this->apcOutBones[local_14];
      if (this_00 != (IntBone_MDL7 *)0x0) {
        IntBone_MDL7::~IntBone_MDL7(this_00);
        operator_delete(this_00);
      }
    }
    if (this->apcOutBones != (IntBone_MDL7 **)0x0) {
      operator_delete__(this->apcOutBones);
    }
  }
  std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::~vector(&this->pcMats);
  std::vector<bool,_std::allocator<bool>_>::~vector(&this->abNeedMaterials);
  return;
}

Assistant:

~IntSharedData_MDL7()
    {
        // kill all bones
        if (this->apcOutBones)
        {
            for (unsigned int m = 0; m < iNum;++m)
                delete this->apcOutBones[m];
            delete[] this->apcOutBones;
        }
    }